

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O2

void __thiscall timeoffsets_tests::timeoffsets::test_method(timeoffsets *this)

{
  long lVar1;
  seconds sVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  check_type cVar5;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  TimeOffsets offsets;
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  local_b8;
  allocator_type *paStack_a0;
  Warnings warnings;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(&warnings);
  TimeOffsets::TimeOffsets(&offsets,&warnings);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  paStack_a0 = (allocator_type *)&local_180;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_188 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar2.__r == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,_cVar5,(size_t)&local_190,0x1e);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffffffffffffe;
  paStack_a0 = (allocator_type *)0xfffffffffffffffd;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_170,__l,(allocator_type *)&local_180);
  AddMulti(&offsets,(vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_170);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base((_Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_170);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = &DAT_00000022;
  file_00.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar2.__r == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1b8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  paStack_a0 = (allocator_type *)&local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,_cVar5,(size_t)&local_1c0,0x22);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  TimeOffsets::Add(&offsets,(seconds)0xfffffffffffffffc);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x26;
  file_01.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar2.__r == -2);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == -2s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1e8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  paStack_a0 = (allocator_type *)&local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,_cVar5,(size_t)&local_1f0,0x26);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_170._0_8_ = (pointer)0x5;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_b8,4,(value_type *)&local_170,(allocator_type *)&local_180);
  AddMulti(&offsets,(vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_b8);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base(&local_b8);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar2.__r == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_218 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  paStack_a0 = (allocator_type *)&local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,_cVar5,(size_t)&local_220,0x2a);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_170._0_8_ = (pointer)0xa;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_b8,0x29,(value_type *)&local_170,(allocator_type *)&local_180);
  AddMulti(&offsets,(vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_b8);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base(&local_b8);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x2e;
  file_03.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar2.__r == 10);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 10s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_248 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  paStack_a0 = (allocator_type *)&local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,_cVar5,(size_t)&local_250,0x2e);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_170._0_8_ = &DAT_0000000f;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_b8,0x19,(value_type *)&local_170,(allocator_type *)&local_180);
  AddMulti(&offsets,(vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_b8);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base(&local_b8);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = &DAT_00000032;
  file_04.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  sVar2 = TimeOffsets::Median(&offsets);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar2.__r == 0xf);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 15s";
  local_178 = "";
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b8._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::unit_test::lazy_ostream::inst;
  paStack_a0 = (allocator_type *)&local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_b8,1,0,WARN,0xc3dd55,(size_t)&stack0xfffffffffffffd80
             ,0x32);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Deque_base(&offsets.m_offsets.
                  super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                );
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::~_Rb_tree(&warnings.m_warnings._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets)
{
    node::Warnings warnings{};
    TimeOffsets offsets{warnings};
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {{0s, -1s, -2s, -3s}});
    // median should be zero for < 5 offsets
    BOOST_CHECK(offsets.Median() == 0s);

    offsets.Add(-4s);
    // we now have 5 offsets: [-4, -3, -2, -1, 0]
    BOOST_CHECK(offsets.Median() == -2s);

    AddMulti(offsets, {4, 5s});
    // we now have 9 offsets: [-4, -3, -2, -1, 0, 5, 5, 5, 5]
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {41, 10s});
    // the TimeOffsets is now at capacity with 50 offsets, oldest offsets is discarded for any additional offset
    BOOST_CHECK(offsets.Median() == 10s);

    AddMulti(offsets, {25, 15s});
    // we now have 25 offsets of 10s followed by 25 offsets of 15s
    BOOST_CHECK(offsets.Median() == 15s);
}